

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O3

bool __thiscall
QUtcTimeZonePrivate::isTimeZoneIdAvailable(QUtcTimeZonePrivate *this,QByteArray *ianaId)

{
  char *pcVar1;
  qsizetype qVar2;
  long lVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  QByteArrayView ianaIds;
  QByteArrayView id;
  
  pcVar1 = (ianaId->d).ptr;
  qVar2 = (ianaId->d).size;
  lVar6 = 0;
  do {
    ianaIds.m_data = "Asia/Kabul" + *(ushort *)((long)&QtTimeZoneCldr::utcDataTable + lVar6);
    lVar5 = -1;
    do {
      lVar3 = lVar5 + (ulong)*(ushort *)((long)&QtTimeZoneCldr::utcDataTable + lVar6) + 1;
      lVar5 = lVar5 + 1;
    } while ("Asia/Kabul"[lVar3] != '\0');
    ianaIds.m_size = lVar5;
    id.m_data = pcVar1;
    id.m_size = qVar2;
    bVar4 = isEntryInIanaList(id,ianaIds);
  } while ((!bVar4) && (lVar6 = lVar6 + 8, lVar6 != 0x150));
  return bVar4;
}

Assistant:

bool QUtcTimeZonePrivate::isTimeZoneIdAvailable(const QByteArray &ianaId) const
{
    // Only the zone IDs supplied by CLDR and recognized by constructor.
    for (const UtcData &data : utcDataTable) {
        if (isEntryInIanaList(ianaId, data.id()))
            return true;
    }
    // Callers may want to || offsetFromUtcString(ianaId) != invalidSeconds(),
    // but those are technically not IANA IDs and the custom QTimeZone
    // constructor needs the return here to reflect that.
    return false;
}